

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O0

void test_broadcast(void)

{
  socklen_t in_ECX;
  int __oflag;
  undefined4 extraout_EDX;
  int __oflag_00;
  undefined4 extraout_var;
  char *in_RSI;
  char *__file;
  thread t2;
  thread t1;
  UDPsocket cs;
  UDPsocket ss;
  UDPsocket *this;
  type *in_stack_ffffffffffffff98;
  UDPsocket *in_stack_ffffffffffffffa0;
  UDPsocket local_2c;
  
  this = &local_2c;
  UDPsocket::UDPsocket(in_stack_ffffffffffffffa0);
  UDPsocket::open(this,in_RSI,__oflag);
  __file = (char *)0x7e4;
  UDPsocket::bind(&local_2c,0x7e4,(sockaddr *)CONCAT44(extraout_var,extraout_EDX),in_ECX);
  UDPsocket::UDPsocket(in_stack_ffffffffffffffa0);
  UDPsocket::open((UDPsocket *)&stack0xffffffffffffff98,__file,__oflag_00);
  UDPsocket::broadcast(this,0);
  std::thread::thread<test_broadcast()::__0,,void>
            ((thread *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::thread::thread<test_broadcast()::__1,,void>
            ((thread *)in_stack_ffffffffffffffa0,(type *)in_stack_ffffffffffffff98);
  std::thread::join();
  std::thread::join();
  std::thread::~thread((thread *)0x10254c);
  std::thread::~thread((thread *)0x102556);
  UDPsocket::~UDPsocket((UDPsocket *)0x102560);
  UDPsocket::~UDPsocket((UDPsocket *)0x10256a);
  return;
}

Assistant:

void test_broadcast()
{
	UDPsocket ss;
	ss.open();
	ss.bind(PortNo);

	UDPsocket cs;
	cs.open();
	cs.broadcast(true);

	auto t1 = std::thread([&ss, &cs]
	{
		std::this_thread::sleep_for(IterDuration * 1.25);
		for (uint16_t i = 0; i < 2 * IterCount; ++i)
		{
			UDPsocket::IPv4 ipaddr;
			std::string data;
			if (ss.recv(data, ipaddr) < 0)
			{
				fprintf(stderr, "recv(): failed\n");
			}
			else
			{
				if (!data.empty())
				{
					fprintf(stderr, "%s  '%s'\n", ipaddr.to_string().c_str(), data.c_str());
					if (data.compare(0, 8, "MESSAGE?"s) == 0)
					{
						ipaddr.port = PortNo;
						if ((i & 0x2 ? cs : ss).send("MESSAGE!"s, ipaddr) < 0)
						{
							fprintf(stderr, "send(): failed (REP)\n");
						}
					}
				}
			}
		}
		ss.close();
	});

	auto t2 = std::thread([&cs]
	{
		for (uint8_t i = 0; i < IterCount; ++i)
		{
			if (cs.send("MESSAGE?"s, UDPsocket::IPv4::Broadcast(PortNo)) < 0)
			{
				fprintf(stderr, "send(): failed (REQ)\n");
			}
			std::this_thread::sleep_for(IterDuration);
		}
		cs.close();
	});

	t1.join();
	t2.join();
}